

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddCorr.c
# Opt level: O2

st__retval CorrelCleanUp(char *key,char *value,char *arg)

{
  free(key);
  free(value);
  return st__CONTINUE;
}

Assistant:

static enum st__retval
CorrelCleanUp(
  char * key,
  char * value,
  char * arg)
{
    double      *d;
    HashEntry *entry;

    entry = (HashEntry *) key;
    ABC_FREE(entry);
    d = (double *)value;
    ABC_FREE(d);
    return st__CONTINUE;

}